

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
          (QPDFPageLabelDocumentHelper *this,QPDF *qpdf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDFNumberTreeObjectHelper *pQVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  Members *__p;
  QPDFObjectHandle root;
  undefined1 local_79;
  string local_78;
  QPDFNumberTreeObjectHelper *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  string local_48;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFPageLabelDocumentHelper_002ebbf8;
  __p = (Members *)operator_new(0x10);
  (__p->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m).super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFPageLabelDocumentHelper::Members*>
            (&(this->m).
              super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  QPDF::getRoot((QPDF *)&local_48);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/PageLabels","");
  bVar5 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_48,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/PageLabels","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_48.field_2,&local_48);
    local_58 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<QPDFNumberTreeObjectHelper,std::allocator<QPDFNumberTreeObjectHelper>,QPDFObjectHandle,QPDF&>
              (&_Stack_50,&local_58,(allocator<QPDFNumberTreeObjectHelper> *)&local_79,
               (QPDFObjectHandle *)&local_48.field_2,(this->super_QPDFDocumentHelper).qpdf);
    _Var4._M_pi = _Stack_50._M_pi;
    pQVar3 = local_58;
    peVar2 = (this->m).
             super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_58 = (QPDFNumberTreeObjectHelper *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (peVar2->labels).
              super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (peVar2->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pQVar3;
    (peVar2->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
  return;
}

Assistant:

QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (root.hasKey("/PageLabels")) {
        m->labels =
            std::make_shared<QPDFNumberTreeObjectHelper>(root.getKey("/PageLabels"), this->qpdf);
    }
}